

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_ChangeFlag
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  AActor *actor;
  bool bVar5;
  FString flagname;
  FString FStack_28;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003d96fe;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    actor = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (actor != (AActor *)0x0) {
        pPVar3 = (actor->super_DThinker).super_DObject.Class;
        if (pPVar3 == (PClass *)0x0) {
          iVar2 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
          pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
          (actor->super_DThinker).super_DObject.Class = pPVar3;
        }
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d96fe;
        }
        goto LAB_003d9696;
      }
    }
    else if (actor != (AActor *)0x0) goto LAB_003d96ee;
    actor = (AActor *)0x0;
LAB_003d9696:
    if (numparam == 1) {
      pcVar4 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x02') {
        FString::AttachToOther(&FStack_28,(FString *)(param + 1));
        if (numparam < 3) {
          pcVar4 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\0') {
            ModActorFlag(actor,&FStack_28,param[2].field_0.i != 0,true);
            FString::~FString(&FStack_28);
            return 0;
          }
          pcVar4 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x11b6,
                      "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar4 = "param[paramnum].Type == REGT_STRING";
    }
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11b5,
                  "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003d96ee:
  pcVar4 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003d96fe:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x11b4,
                "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ChangeFlag)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STRING	(flagname);
	PARAM_BOOL		(value);

	ModActorFlag(self, flagname, value);
	return 0;
}